

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall crnlib::symbol_codec::arith_renorm_enc_interval(symbol_codec *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = (this->m_arith_output_buf).m_size;
  uVar2 = this->m_arith_base;
  do {
    if ((this->m_arith_output_buf).m_capacity <= uVar3) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_arith_output_buf,uVar3 + 1,true,1,(object_mover)0x0,
                 false);
      uVar3 = (this->m_arith_output_buf).m_size;
    }
    (this->m_arith_output_buf).m_p[uVar3] = (uchar)(uVar2 >> 0x18);
    uVar2 = this->m_arith_base;
    uVar3 = (this->m_arith_output_buf).m_size + 1;
    (this->m_arith_output_buf).m_size = uVar3;
    this->m_total_bits_written = this->m_total_bits_written + 8;
    uVar2 = uVar2 << 8;
    this->m_arith_base = uVar2;
    uVar1 = this->m_arith_length << 8;
    this->m_arith_length = uVar1;
  } while (uVar1 < 0x1000000);
  return;
}

Assistant:

void symbol_codec::arith_renorm_enc_interval()
    {
        do
        {
            m_arith_output_buf.push_back((m_arith_base >> 24) & 0xFF);
            m_total_bits_written += 8;

            m_arith_base <<= 8;
        } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
    }